

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomx.cpp
# Opt level: O3

void randomx_calculate_hash(randomx_vm *machine,void *input,size_t inputSize,void *output)

{
  int iVar1;
  fenv_t fpstate;
  uint64_t tempHash [8];
  fenv_t fStack_98;
  undefined1 local_78 [72];
  
  fegetenv(&fStack_98);
  randomx_blake2b(local_78,0x40,input,inputSize,(void *)0x0,0);
  (*machine->_vptr_randomx_vm[7])(machine,local_78);
  randomx_vm::resetRoundingMode(machine);
  iVar1 = 7;
  do {
    (*machine->_vptr_randomx_vm[8])(machine,local_78);
    randomx_blake2b(local_78,0x40,&machine->reg,0x100,(void *)0x0,0);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  (*machine->_vptr_randomx_vm[8])(machine,local_78);
  (*machine->_vptr_randomx_vm[3])(machine,output,0x20);
  fesetenv(&fStack_98);
  return;
}

Assistant:

void randomx_calculate_hash(randomx_vm *machine, const void *input, size_t inputSize, void *output) {
		assert(machine != nullptr);
		assert(inputSize == 0 || input != nullptr);
		assert(output != nullptr);
		fenv_t fpstate;
		fegetenv(&fpstate);
		alignas(16) uint64_t tempHash[8];
		int blakeResult = blake2b(tempHash, sizeof(tempHash), input, inputSize, nullptr, 0);
		assert(blakeResult == 0);
		machine->initScratchpad(&tempHash);
		machine->resetRoundingMode();
		for (int chain = 0; chain < RANDOMX_PROGRAM_COUNT - 1; ++chain) {
			machine->run(&tempHash);
			blakeResult = blake2b(tempHash, sizeof(tempHash), machine->getRegisterFile(), sizeof(randomx::RegisterFile), nullptr, 0);
			assert(blakeResult == 0);
		}
		machine->run(&tempHash);
		machine->getFinalResult(output, RANDOMX_HASH_SIZE);
		fesetenv(&fpstate);
	}